

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void lj_record_tailcall(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  int iVar1;
  uint in_ESI;
  long in_RDI;
  BCReg cbase;
  ptrdiff_t in_stack_00000040;
  BCReg in_stack_0000004c;
  jit_State *in_stack_00000050;
  TraceError in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 local_c;
  
  rec_call_setup(in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  local_c = in_ESI;
  if ((*(uint *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x10) + -4) & 7) == 3) {
    in_stack_ffffffffffffffe4 = *(int *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x10) + -4) >> 3;
    iVar1 = *(int *)(in_RDI + 0xe4) + -1;
    *(int *)(in_RDI + 0xe4) = iVar1;
    if (iVar1 < 0) {
      lj_trace_err((jit_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
    }
    *(uint *)(in_RDI + 0x98) = *(int *)(in_RDI + 0x98) - in_stack_ffffffffffffffe4;
    *(ulong *)(in_RDI + 0x88) = *(long *)(in_RDI + 0x88) + (ulong)in_stack_ffffffffffffffe4 * -4;
    local_c = in_stack_ffffffffffffffe4 + in_ESI;
  }
  memmove((void *)(*(long *)(in_RDI + 0x88) + -4),
          (void *)(*(long *)(in_RDI + 0x88) + (ulong)local_c * 4),
          (ulong)(*(int *)(in_RDI + 0x94) + 1) << 2);
  iVar1 = *(int *)(in_RDI + 0xe0) + 1;
  *(int *)(in_RDI + 0xe0) = iVar1;
  if (*(int *)(in_RDI + 0xdc) < iVar1) {
    lj_trace_err((jit_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void lj_record_tailcall(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  rec_call_setup(J, func, nargs);
  if (frame_isvarg(J->L->base - 1)) {
    BCReg cbase = (BCReg)frame_delta(J->L->base - 1);
    if (--J->framedepth < 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    func += cbase;
  }
  /* Move func + args down. */
  if (LJ_FR2 && J->baseslot == 2)
    J->base[func+1] = TREF_FRAME;
  memmove(&J->base[-1-LJ_FR2], &J->base[func], sizeof(TRef)*(J->maxslot+1+LJ_FR2));
  /* Note: the new TREF_FRAME is now at J->base[-1] (even for slot #0). */
  /* Tailcalls can form a loop, so count towards the loop unroll limit. */
  if (++J->tailcalled > J->loopunroll)
    lj_trace_err(J, LJ_TRERR_LUNROLL);
}